

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O1

int FreeTypeFaceWrapper::IOutlineEnumerator::outline_conicto
              (FT_Vector *control,FT_Vector *to,void *closure)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  short sVar7;
  short sVar8;
  FT_Pos FVar9;
  byte bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  
  lVar1 = *(long *)((long)closure + 0x10);
  lVar2 = *(long *)((long)closure + 0x18);
  FVar9 = to->y;
  *(FT_Pos *)((long)closure + 0x10) = to->x;
  *(FT_Pos *)((long)closure + 0x18) = FVar9;
  lVar3 = control->x;
  dVar6 = (double)(lVar3 - lVar1) * 0.6666666666666666;
  if (0.0 <= dVar6) {
    dVar6 = floor(dVar6 + 0.5);
    uVar11 = SUB84(dVar6,0);
    uVar15 = (undefined4)((ulong)dVar6 >> 0x20);
  }
  else {
    dVar6 = ceil(dVar6 + -0.5);
    uVar11 = SUB84(dVar6,0);
    uVar15 = (undefined4)((ulong)dVar6 >> 0x20);
  }
  lVar4 = control->y;
  dVar6 = (double)(lVar4 - lVar2) * 0.6666666666666666;
  if (0.0 <= dVar6) {
    dVar6 = floor(dVar6 + 0.5);
    uVar12 = SUB84(dVar6,0);
    uVar16 = (undefined4)((ulong)dVar6 >> 0x20);
  }
  else {
    dVar6 = ceil(dVar6 + -0.5);
    uVar12 = SUB84(dVar6,0);
    uVar16 = (undefined4)((ulong)dVar6 >> 0x20);
  }
  lVar5 = to->x;
  dVar6 = (double)(lVar3 - lVar5) * 0.6666666666666666;
  if (0.0 <= dVar6) {
    dVar6 = floor(dVar6 + 0.5);
    uVar13 = SUB84(dVar6,0);
    uVar17 = (undefined4)((ulong)dVar6 >> 0x20);
  }
  else {
    dVar6 = ceil(dVar6 + -0.5);
    uVar13 = SUB84(dVar6,0);
    uVar17 = (undefined4)((ulong)dVar6 >> 0x20);
  }
  lVar3 = to->y;
  dVar6 = (double)(lVar4 - lVar3) * 0.6666666666666666;
  if (0.0 <= dVar6) {
    dVar6 = floor(dVar6 + 0.5);
    uVar14 = SUB84(dVar6,0);
    uVar18 = (undefined4)((ulong)dVar6 >> 0x20);
  }
  else {
    dVar6 = ceil(dVar6 + -0.5);
    uVar14 = SUB84(dVar6,0);
    uVar18 = (undefined4)((ulong)dVar6 >> 0x20);
  }
  sVar7 = (short)lVar5;
  sVar8 = (short)lVar3;
  bVar10 = (**(code **)(*closure + 0x20))
                     (closure,(int)(short)((short)(long)(double)CONCAT44(uVar15,uVar11) +
                                          (short)lVar1),
                      (int)(short)((short)(long)(double)CONCAT44(uVar16,uVar12) + (short)lVar2),
                      (int)(short)((short)(long)(double)CONCAT44(uVar17,uVar13) + sVar7),
                      (int)(short)((short)(long)(double)CONCAT44(uVar18,uVar14) + sVar8),(int)sVar7,
                      (int)sVar8);
  return (int)(bVar10 ^ 1);
}

Assistant:

int FreeTypeFaceWrapper::IOutlineEnumerator::outline_conicto(const FT_Vector *control, const FT_Vector *to, void *closure) //static
{
	return ( (FreeTypeFaceWrapper::IOutlineEnumerator *)closure )->FTConicto(control, to) ? 0 : 1;
}